

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O3

int __thiscall particleSamples::read_in_particle_samples_UrQMD_binary(particleSamples *this)

{
  pretty_ostream *this_00;
  ifstream *piVar1;
  vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
  *this_01;
  iterator __position;
  vector<particle_info,std::allocator<particle_info>> *this_02;
  undefined4 uVar2;
  particleSamples *ppVar3;
  int urqmd_isospin;
  int i;
  int iVar4;
  long lVar5;
  anon_struct_120_15_f999644b *paVar6;
  iterator __position_00;
  int i_1;
  byte bVar7;
  int n_particle;
  float particle_array [9];
  int idummy;
  string temp_string;
  int info_array [6];
  int local_1a4;
  int local_1a0;
  int local_19c;
  long local_198;
  particleSamples *local_190;
  float local_188 [10];
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  vector<particle_info,_std::allocator<particle_info>_> *local_e0;
  double local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [48];
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  int local_48 [6];
  
  bVar7 = 0;
  clear_out_previous_record(this,this->full_particle_list);
  local_68 = local_58;
  local_60 = 0;
  local_58[0] = 0;
  local_1a4 = 0;
  if (0 < this->event_buffer_size) {
    piVar1 = &this->inputfile;
    this_00 = &this->messager;
    local_198 = 0;
    local_19c = 0;
    local_190 = this;
    do {
      ppVar3 = local_190;
      std::istream::read((char *)piVar1,(long)&local_1a4);
      if (((&ppVar3->field_0x1e8)[*(long *)(*(long *)&ppVar3->inputfile + -0x18)] & 2) != 0) break;
      this_01 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                 *)ppVar3->full_particle_list;
      local_e0 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
      (local_e0->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_e0->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_e0->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __position._M_current =
           *(vector<particle_info,_std::allocator<particle_info>_> ***)(this_01 + 8);
      if (__position._M_current ==
          *(vector<particle_info,_std::allocator<particle_info>_> ***)(this_01 + 0x10)) {
        std::
        vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
        ::_M_realloc_insert<std::vector<particle_info,std::allocator<particle_info>>*>
                  (this_01,__position,&local_e0);
      }
      else {
        *__position._M_current = local_e0;
        *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
      }
      iVar4 = 8;
      do {
        local_e0 = (vector<particle_info,_std::allocator<particle_info>_> *)
                   ((ulong)local_e0 & 0xffffffff00000000);
        std::istream::read((char *)piVar1,(long)&local_e0);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      if (0 < local_1a4) {
        local_1a0 = 0;
        do {
          lVar5 = 0;
          do {
            std::istream::read((char *)piVar1,(long)&local_e0);
            local_48[lVar5] = (int)local_e0._0_4_;
            urqmd_isospin = local_48[1];
            iVar4 = local_48[0];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 6);
          lVar5 = 0;
          do {
            std::istream::read((char *)piVar1,(long)&local_e0);
            local_188[lVar5] = local_e0._0_4_;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 9);
          iVar4 = get_pdg_id(local_190,iVar4,urqmd_isospin);
          local_e0 = (vector<particle_info,_std::allocator<particle_info>_> *)
                     CONCAT44(local_e0._4_4_,iVar4);
          local_d8 = (double)local_188[0];
          local_a8._8_4_ = SUB84((double)SUB84(local_188._8_8_,4),0);
          local_a8._0_8_ = (double)(float)local_188._8_8_;
          local_a8._12_4_ = (int)((ulong)(double)SUB84(local_188._8_8_,4) >> 0x20);
          local_98._8_4_ = SUB84((double)local_188[1],0);
          local_98._0_8_ = (double)local_188[4];
          local_98._12_4_ = (int)((ulong)(double)local_188[1] >> 0x20);
          local_c8._8_4_ = SUB84((double)SUB84(local_188._24_8_,4),0);
          local_c8._0_8_ = (double)(float)local_188._24_8_;
          local_c8._12_4_ = (int)((ulong)(double)SUB84(local_188._24_8_,4) >> 0x20);
          local_b8._8_4_ = SUB84((double)local_188[5],0);
          local_b8._0_8_ = (double)local_188[8];
          local_b8._12_4_ = (int)((ulong)(double)local_188[5] >> 0x20);
          if (iVar4 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"nev = ",6);
            std::ostream::operator<<(this_00,(int)local_198);
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"error","");
            pretty_ostream::flush(this_00,&local_100);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"nparticles = ",0xd);
            std::ostream::operator<<(this_00,local_1a4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ipart = ",10);
            std::ostream::operator<<(this_00,local_1a0);
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"error","");
            pretty_ostream::flush(this_00,&local_120);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mass = ",7);
            std::ostream::_M_insert<double>(local_d8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", E = ",6);
            std::ostream::_M_insert<double>((double)local_b8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", px = ",7);
            std::ostream::_M_insert<double>((double)local_c8._0_8_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", py = ",7);
            std::ostream::_M_insert<double>((double)local_c8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", pz = ",7);
            std::ostream::_M_insert<double>((double)local_b8._0_8_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", t = ",6);
            std::ostream::_M_insert<double>((double)local_98._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", x = ",6);
            std::ostream::_M_insert<double>((double)local_a8._0_8_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", y = ",6);
            std::ostream::_M_insert<double>((double)local_a8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", z = ",6);
            std::ostream::_M_insert<double>((double)local_98._0_8_);
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"error","");
            pretty_ostream::flush(this_00,&local_140);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
              operator_delete(local_140._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"Ignore this particle!",0x15);
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"error","");
            pretty_ostream::flush(this_00,&local_160);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p);
            }
          }
          else {
            this_02 = (vector<particle_info,std::allocator<particle_info>> *)
                      (local_190->full_particle_list->
                      super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                      )._M_impl.super__Vector_impl_data._M_start[local_198];
            __position_00._M_current = *(anon_struct_120_15_f999644b **)(this_02 + 8);
            if (__position_00._M_current == *(anon_struct_120_15_f999644b **)(this_02 + 0x10)) {
              std::vector<particle_info,std::allocator<particle_info>>::
              _M_realloc_insert<particle_info_const&>
                        (this_02,__position_00,(anon_struct_120_15_f999644b *)&local_e0);
            }
            else {
              paVar6 = (anon_struct_120_15_f999644b *)&local_e0;
              for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
                uVar2 = *(undefined4 *)&paVar6->field_0x4;
                (__position_00._M_current)->monval = paVar6->monval;
                *(undefined4 *)&(__position_00._M_current)->field_0x4 = uVar2;
                paVar6 = (anon_struct_120_15_f999644b *)((long)paVar6 + (ulong)bVar7 * -0x10 + 8);
                __position_00._M_current = __position_00._M_current + (ulong)bVar7 * -0x10 + 8;
              }
              *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 0x78;
            }
          }
          local_1a0 = local_1a0 + 1;
        } while (local_1a0 < local_1a4);
      }
      local_19c = local_19c + local_1a4;
      local_198 = local_198 + 1;
    } while (local_19c < local_190->event_buffer_size);
    if (local_68 != local_58) {
      operator_delete(local_68);
    }
  }
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_UrQMD_binary() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list);

    std::string temp_string;
    int n_particle = 0;
    int ievent = 0;
    int urqmd_pid, urqmd_iso3;
    int num_particles = 0;
    while (num_particles < event_buffer_size) {
        inputfile.read(reinterpret_cast<char *>(&n_particle), sizeof(int));
        if (inputfile.eof()) break;

        full_particle_list->push_back(new vector<particle_info>);

        // then get one useless line
        for (int i = 0; i < 8; i++) {
            int idummy = 0;
            inputfile.read(reinterpret_cast<char *>(&idummy), sizeof(int));
        }

        // std::cout << "n_particle = " << n_particle << std::endl;
        for (int ipart = 0; ipart < n_particle; ipart++) {
            int info_array[6];
            for (int i = 0; i < 6; i++) {
                int temp;
                inputfile.read(reinterpret_cast<char *>(&temp), sizeof(int));
                info_array[i] = temp;
            }
            urqmd_pid = info_array[0];
            urqmd_iso3 = info_array[1];

            float particle_array[9];
            for (int i = 0; i < 9; i++) {
                float temp;
                inputfile.read(reinterpret_cast<char *>(&temp), sizeof(float));
                particle_array[i] = temp;
            }

            particle_info temp_particle_info;
            temp_particle_info.monval = get_pdg_id(urqmd_pid, urqmd_iso3);
            temp_particle_info.mass = particle_array[0];
            temp_particle_info.t = particle_array[1];
            temp_particle_info.x = particle_array[2];
            temp_particle_info.y = particle_array[3];
            temp_particle_info.z = particle_array[4];
            temp_particle_info.E = particle_array[5];
            temp_particle_info.px = particle_array[6];
            temp_particle_info.py = particle_array[7];
            temp_particle_info.pz = particle_array[8];
            if (temp_particle_info.monval == 0) {
                messager << "nev = " << ievent;
                messager.flush("error");
                messager << "nparticles = " << n_particle
                         << ", ipart = " << ipart;
                messager.flush("error");
                messager << "mass = " << temp_particle_info.mass
                         << ", E = " << temp_particle_info.E
                         << ", px = " << temp_particle_info.px
                         << ", py = " << temp_particle_info.py
                         << ", pz = " << temp_particle_info.pz
                         << ", t = " << temp_particle_info.t
                         << ", x = " << temp_particle_info.x
                         << ", y = " << temp_particle_info.y
                         << ", z = " << temp_particle_info.z;
                messager.flush("error");
                messager << "Ignore this particle!";
                messager.flush("error");
            } else {
                (*full_particle_list)[ievent]->push_back(temp_particle_info);
            }
        }
        num_particles += n_particle;
        ievent++;
    }
    return (0);
}